

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::SwiftGenerator
          (SwiftGenerator *this,Parser *parser,string *path,string *file_name)

{
  long lVar1;
  long *plVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Config result;
  allocator_type local_d6a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d69;
  string local_d68;
  string local_d48;
  CodeWriter *local_d28;
  string local_d20;
  string local_d00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ce0;
  Config local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  undefined4 *local_b40;
  undefined8 local_b38;
  undefined4 local_b30;
  undefined2 local_b2c;
  undefined4 *local_b20;
  undefined8 local_b18;
  undefined4 local_b10;
  undefined2 local_b0c;
  undefined1 local_b0a;
  undefined4 *local_b00;
  undefined8 local_af8;
  undefined4 local_af0;
  undefined1 local_aec;
  undefined8 *local_ae0;
  undefined8 local_ad8;
  undefined8 local_ad0;
  undefined2 local_ac8;
  undefined7 *local_ac0;
  undefined8 local_ab8;
  undefined7 local_ab0;
  undefined4 uStack_aa9;
  undefined1 local_aa5;
  undefined4 *local_aa0;
  undefined8 local_a98;
  undefined4 local_a90;
  undefined1 local_a8c;
  undefined4 *local_a80;
  undefined8 local_a78;
  undefined4 local_a70;
  undefined2 local_a6c;
  undefined1 local_a6a;
  undefined4 *local_a60;
  undefined8 local_a58;
  undefined4 local_a50;
  undefined1 local_a4c;
  undefined4 *local_a40;
  undefined8 local_a38;
  undefined4 local_a30;
  undefined1 local_a2c;
  undefined1 local_a2b;
  undefined8 *local_a20;
  undefined8 local_a18;
  undefined8 local_a10;
  undefined1 local_a08;
  undefined2 *local_a00;
  undefined8 local_9f8;
  undefined2 local_9f0;
  undefined1 local_9ee;
  undefined1 local_9ed;
  undefined4 *local_9e0;
  undefined8 local_9d8;
  undefined4 local_9d0;
  undefined1 local_9cc;
  undefined8 *local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined1 local_9a8;
  undefined4 *local_9a0;
  undefined8 local_998;
  undefined4 local_990;
  undefined3 uStack_98c;
  undefined1 local_989;
  undefined8 *local_980;
  undefined8 local_978;
  undefined8 local_970;
  undefined1 local_968;
  undefined4 *local_960;
  undefined8 local_958;
  undefined4 local_950;
  undefined2 local_94c;
  undefined1 local_94a;
  undefined8 *local_940;
  undefined8 local_938;
  undefined8 local_930;
  undefined1 local_928;
  undefined4 *local_920;
  undefined8 local_918;
  undefined4 local_910;
  undefined2 local_90c;
  undefined1 local_90a;
  undefined4 *local_900;
  undefined8 local_8f8;
  undefined4 local_8f0;
  undefined2 local_8ec;
  undefined1 local_8ea;
  undefined8 *local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined1 local_8c8;
  undefined1 local_8c7;
  undefined8 *local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined1 local_8a8;
  undefined1 local_8a7;
  undefined2 *local_8a0;
  undefined8 local_898;
  undefined2 local_890;
  undefined1 local_88e;
  undefined1 local_88d;
  undefined4 *local_880;
  undefined8 local_878;
  undefined4 local_870;
  undefined1 local_86c;
  undefined1 local_86b;
  undefined4 *local_860;
  undefined8 local_858;
  undefined4 local_850;
  undefined1 local_84c;
  undefined8 *local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined1 local_828;
  undefined4 *local_820;
  undefined8 local_818;
  undefined4 local_810;
  undefined3 uStack_80c;
  undefined1 local_809;
  undefined4 *local_800;
  undefined8 local_7f8;
  undefined4 local_7f0;
  undefined1 local_7ec;
  undefined1 local_7eb;
  undefined2 *local_7e0;
  undefined8 local_7d8;
  undefined2 local_7d0;
  undefined1 local_7ce;
  undefined4 *local_7c0;
  undefined8 local_7b8;
  undefined4 local_7b0;
  undefined1 local_7ac;
  undefined7 *local_7a0;
  undefined8 local_798;
  undefined7 local_790;
  undefined4 uStack_789;
  undefined1 local_785;
  undefined2 *local_780;
  undefined8 local_778;
  undefined2 local_770;
  undefined1 local_76e;
  undefined1 local_76d;
  undefined4 *local_760;
  undefined8 local_758;
  undefined4 local_750;
  undefined1 local_74c;
  undefined1 local_74b;
  undefined2 *local_740;
  undefined8 local_738;
  undefined2 local_730;
  undefined1 local_72e;
  undefined2 *local_720;
  undefined8 local_718;
  undefined2 local_710;
  undefined1 local_70e;
  undefined4 *local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  undefined2 local_6ec;
  undefined1 local_6ea;
  undefined4 *local_6e0;
  undefined8 local_6d8;
  undefined4 local_6d0;
  undefined2 local_6cc;
  undefined1 local_6ca;
  undefined4 *local_6c0;
  undefined8 local_6b8;
  undefined4 local_6b0;
  undefined2 local_6ac;
  undefined1 local_6aa;
  undefined4 *local_6a0;
  undefined8 local_698;
  undefined4 local_690;
  undefined1 local_68c;
  undefined1 local_68b;
  undefined4 *local_680;
  undefined8 local_678;
  undefined4 local_670;
  undefined1 local_66c;
  undefined1 local_66b;
  undefined2 *local_660;
  undefined8 local_658;
  undefined2 local_650;
  undefined1 local_64e;
  undefined1 local_64d;
  undefined4 *local_640;
  undefined8 local_638;
  undefined4 local_630;
  undefined1 local_62c;
  undefined1 local_62b;
  undefined4 *local_620;
  undefined8 local_618;
  undefined4 local_610;
  undefined1 local_60c;
  undefined1 local_60b;
  undefined2 *local_600;
  undefined8 local_5f8;
  undefined2 local_5f0;
  undefined1 local_5ee;
  undefined2 *local_5e0;
  undefined8 local_5d8;
  undefined2 local_5d0;
  undefined1 local_5ce;
  undefined1 local_5cd;
  undefined4 *local_5c0;
  undefined8 local_5b8;
  undefined4 local_5b0;
  undefined1 local_5ac;
  undefined1 local_5ab;
  undefined4 *local_5a0;
  undefined8 local_598;
  undefined4 local_590;
  undefined1 local_58c;
  undefined4 *local_580;
  undefined8 local_578;
  undefined4 local_570;
  undefined1 local_56c;
  undefined4 *local_560;
  undefined8 local_558;
  undefined4 local_550;
  undefined1 local_54c;
  undefined1 local_54b;
  undefined4 *local_540;
  undefined8 local_538;
  undefined4 local_530;
  undefined2 local_52c;
  undefined1 local_52a;
  undefined4 *local_520;
  undefined8 local_518;
  undefined4 local_510;
  undefined1 local_50c;
  undefined2 *local_500;
  undefined8 local_4f8;
  undefined2 local_4f0;
  undefined1 local_4ee;
  undefined1 local_4ed;
  undefined5 *local_4e0;
  undefined8 local_4d8;
  undefined5 local_4d0;
  undefined3 uStack_4cb;
  undefined5 uStack_4c8;
  undefined1 local_4c3;
  undefined7 *local_4c0;
  undefined8 local_4b8;
  undefined7 local_4b0;
  undefined4 uStack_4a9;
  undefined1 local_4a5;
  undefined4 *local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  undefined3 uStack_48c;
  undefined1 local_489;
  undefined4 *local_480;
  undefined8 local_478;
  undefined4 local_470;
  undefined2 local_46c;
  undefined1 local_46a;
  undefined4 *local_460;
  undefined8 local_458;
  undefined4 local_450;
  undefined1 local_44c;
  undefined1 local_44b;
  undefined2 *local_440;
  undefined8 local_438;
  undefined2 local_430;
  undefined1 local_42e;
  undefined1 local_42d;
  undefined4 *local_420;
  undefined8 local_418;
  undefined4 local_410;
  undefined1 local_40c;
  undefined1 local_40b;
  undefined8 *local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8;
  undefined4 *local_3e0;
  undefined8 local_3d8;
  undefined4 local_3d0;
  undefined1 local_3cc;
  undefined4 *local_3c0;
  undefined8 local_3b8;
  undefined4 local_3b0;
  undefined1 local_3ac;
  undefined8 *local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined1 local_388;
  undefined4 *local_380;
  undefined8 local_378;
  undefined4 local_370;
  undefined1 local_36c;
  undefined7 *local_360;
  undefined8 local_358;
  undefined7 local_350;
  undefined4 uStack_349;
  undefined1 local_345;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined1 local_328;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined1 local_308;
  undefined4 *local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined3 uStack_2ec;
  undefined1 local_2e9;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined2 local_2c8;
  undefined1 local_2c6;
  undefined4 *local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined2 local_2ac;
  undefined1 local_2aa;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined1 local_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined4 *local_260;
  undefined8 local_258;
  undefined4 local_250;
  undefined1 local_24c;
  undefined1 local_24b;
  undefined2 *local_240;
  undefined8 local_238;
  undefined2 local_230;
  undefined1 local_22e;
  undefined1 local_22d;
  undefined4 *local_220;
  undefined8 local_218;
  undefined4 local_210;
  undefined1 local_20c;
  undefined4 *local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  undefined3 uStack_1ec;
  undefined1 local_1e9;
  undefined4 *local_1e0;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined1 local_1cc;
  undefined4 *local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined3 uStack_1ac;
  undefined1 uStack_1a9;
  long *local_1a0 [2];
  undefined8 local_190;
  undefined1 local_180 [136];
  string local_f8 [104];
  string local_90 [32];
  string local_70 [64];
  
  local_d48._M_dataplus._M_p = (pointer)&local_d48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d48,"");
  local_d68._M_dataplus._M_p = (pointer)&local_d68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d68,"_","");
  local_d00._M_dataplus._M_p = (pointer)&local_d00.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d00,"swift","");
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,file_name,&local_d48,&local_d68,&local_d00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d00._M_dataplus._M_p != &local_d00.field_2) {
    operator_delete(local_d00._M_dataplus._M_p,local_d00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
    operator_delete(local_d68._M_dataplus._M_p,local_d68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
    operator_delete(local_d48._M_dataplus._M_p,local_d48.field_2._M_allocated_capacity + 1);
  }
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_003f4610;
  local_d20._M_string_length = 0;
  local_d20.field_2._M_local_buf[0] = '\0';
  local_d20._M_dataplus._M_p = (pointer)&local_d20.field_2;
  CodeWriter::CodeWriter(&this->code_,&local_d20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d20._M_dataplus._M_p != &local_d20.field_2) {
    operator_delete(local_d20._M_dataplus._M_p,
                    CONCAT71(local_d20.field_2._M_allocated_capacity._1_7_,
                             local_d20.field_2._M_local_buf[0]) + 1);
  }
  (this->keywords_)._M_h._M_buckets = &(this->keywords_)._M_h._M_single_bucket;
  (this->keywords_)._M_h._M_bucket_count = 1;
  (this->keywords_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->keywords_)._M_h._M_element_count = 0;
  (this->keywords_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->keywords_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->keywords_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_cb0.enum_variant_seperator._M_dataplus._M_p =
       (pointer)&local_cb0.enum_variant_seperator.field_2;
  local_cb0.types = kKeep;
  local_cb0.constants = kLowerCamel;
  local_cb0.methods = kLowerCamel;
  local_cb0.functions = kLowerCamel;
  local_cb0.fields = kLowerCamel;
  local_cb0.variables = kLowerCamel;
  local_cb0.variants = kLowerCamel;
  local_cb0.enum_variant_seperator.field_2._M_allocated_capacity._0_2_ = 0x2e;
  local_cb0.enum_variant_seperator._M_string_length = 1;
  local_cb0.escape_keywords = AfterConvertingCase;
  local_cb0.namespaces = kKeep;
  local_cb0.namespace_seperator._M_dataplus._M_p = (pointer)&local_cb0.namespace_seperator.field_2;
  local_cb0.namespace_seperator.field_2._M_allocated_capacity._0_2_ = 0x5f;
  local_cb0.namespace_seperator._M_string_length = 1;
  local_cb0.object_prefix._M_dataplus._M_p = (pointer)&local_cb0.object_prefix.field_2;
  local_cb0.object_prefix._M_string_length = 0;
  local_cb0.object_prefix.field_2._M_local_buf[0] = '\0';
  local_cb0.object_suffix._M_dataplus._M_p = (pointer)&local_cb0.object_suffix.field_2;
  local_cb0.object_suffix.field_2._M_allocated_capacity._0_2_ = 0x54;
  local_cb0.object_suffix._M_string_length = 1;
  local_cb0.keyword_prefix._M_dataplus._M_p = (pointer)&local_cb0.keyword_prefix.field_2;
  local_cb0.keyword_prefix._M_string_length = 0;
  local_cb0.keyword_prefix.field_2._M_local_buf[0] = '\0';
  local_cb0.keyword_suffix._M_dataplus._M_p = (pointer)&local_cb0.keyword_suffix.field_2;
  local_cb0.keyword_suffix.field_2._M_local_buf[0] = '_';
  local_cb0.keyword_suffix._M_string_length = 1;
  local_cb0.keyword_suffix.field_2._M_local_buf[1] = '\0';
  local_cb0.filenames = kKeep;
  local_cb0.directories = kKeep;
  local_cb0.output_path._M_dataplus._M_p = (pointer)&local_cb0.output_path.field_2;
  local_cb0.output_path._M_string_length = 0;
  local_cb0.output_path.field_2._M_local_buf[0] = '\0';
  local_cb0.filename_suffix._M_dataplus._M_p = (pointer)&local_cb0.filename_suffix.field_2;
  local_cb0.filename_suffix.field_2._M_allocated_capacity = 0x746172656e65675f;
  local_cb0.filename_suffix.field_2._8_2_ = 0x6465;
  local_cb0.filename_suffix._M_string_length = 10;
  local_cb0.filename_suffix.field_2._M_local_buf[10] = '\0';
  local_cb0.filename_extension._M_dataplus._M_p = (pointer)&local_cb0.filename_extension.field_2;
  local_cb0.filename_extension.field_2._M_allocated_capacity._0_4_ = 0x6977732e;
  local_cb0.filename_extension.field_2._M_allocated_capacity._4_2_ = 0x7466;
  local_cb0.filename_extension._M_string_length = 6;
  local_cb0.filename_extension.field_2._M_local_buf[6] = '\0';
  local_d28 = &this->code_;
  Namer::Config::Config((Config *)local_180,&local_cb0);
  std::__cxx11::string::_M_assign((string *)(local_180 + 0x68));
  std::__cxx11::string::_M_assign(local_f8);
  std::__cxx11::string::_M_assign(local_90);
  std::__cxx11::string::_M_assign(local_70);
  local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
  local_b60.field_2._M_allocated_capacity._0_6_ = 0x69636f737361;
  local_b60.field_2._M_allocated_capacity._6_2_ = 0x7461;
  local_b60.field_2._8_6_ = 0x657079746465;
  local_b60._M_string_length = 0xe;
  local_b60.field_2._M_local_buf[0xe] = '\0';
  local_b40 = &local_b30;
  local_b30 = 0x73616c63;
  local_b2c = 0x73;
  local_b38 = 5;
  local_b20 = &local_b10;
  local_b10 = 0x6e696564;
  local_b0c = 0x7469;
  local_b18 = 6;
  local_b0a = 0;
  local_b00 = &local_af0;
  local_af0 = 0x6d756e65;
  local_af8 = 4;
  local_aec = 0;
  local_ae0 = &local_ad0;
  local_ad0 = 0x6f69736e65747865;
  local_ac8 = 0x6e;
  local_ad8 = 9;
  local_ac0 = &local_ab0;
  local_ab0 = 0x697270656c6966;
  uStack_aa9 = 0x65746176;
  local_ab8 = 0xb;
  local_aa5 = 0;
  local_aa0 = &local_a90;
  local_a90 = 0x636e7566;
  local_a98 = 4;
  local_a8c = 0;
  local_a80 = &local_a70;
  local_a70 = 0x6f706d69;
  local_a6c = 0x7472;
  local_a78 = 6;
  local_a6a = 0;
  local_a60 = &local_a50;
  local_a50 = 0x74696e69;
  local_a58 = 4;
  local_a4c = 0;
  local_a40 = &local_a30;
  local_a2c = 0x74;
  local_a30 = 0x756f6e69;
  local_a38 = 5;
  local_a2b = 0;
  local_a20 = &local_a10;
  local_a10 = 0x6c616e7265746e69;
  local_a18 = 8;
  local_a08 = 0;
  local_a00 = &local_9f0;
  local_9ee = 0x74;
  local_9f0 = 0x656c;
  local_9f8 = 3;
  local_9ed = 0;
  local_9e0 = &local_9d0;
  local_9d0 = 0x6e65706f;
  local_9d8 = 4;
  local_9cc = 0;
  local_9c0 = &local_9b0;
  local_9b0 = 0x726f74617265706f;
  local_9b8 = 8;
  local_9a8 = 0;
  local_9a0 = &local_990;
  uStack_98c = 0x657461;
  local_990 = 0x76697270;
  local_998 = 7;
  local_989 = 0;
  local_980 = &local_970;
  local_970 = 0x6c6f636f746f7270;
  local_978 = 8;
  local_968 = 0;
  local_960 = &local_950;
  local_94c = 0x6369;
  local_950 = 0x6c627570;
  local_958 = 6;
  local_94a = 0;
  local_940 = &local_930;
  local_930 = 0x73776f7268746572;
  local_938 = 8;
  local_928 = 0;
  local_920 = &local_910;
  local_90c = 0x6369;
  local_910 = 0x74617473;
  local_918 = 6;
  local_90a = 0;
  local_900 = &local_8f0;
  local_8ec = 0x7463;
  local_8f0 = 0x75727473;
  local_8f8 = 6;
  local_8ea = 0;
  local_8e0 = &local_8d0;
  local_8c8 = 0x74;
  local_8d0 = 0x7069726373627573;
  local_8d8 = 9;
  local_8c7 = 0;
  local_8c0 = &local_8b0;
  local_8b0 = 0x61696c6165707974;
  local_8a8 = 0x73;
  local_8b8 = 9;
  local_8a7 = 0;
  local_8a0 = &local_890;
  local_88e = 0x72;
  local_890 = 0x6176;
  local_898 = 3;
  local_88d = 0;
  local_880 = &local_870;
  local_86c = 0x6b;
  local_870 = 0x61657262;
  local_878 = 5;
  local_86b = 0;
  local_860 = &local_850;
  local_850 = 0x65736163;
  local_858 = 4;
  local_84c = 0;
  local_840 = &local_830;
  local_830 = 0x65756e69746e6f63;
  local_838 = 8;
  local_828 = 0;
  local_820 = &local_810;
  uStack_80c = 0x746c75;
  local_810 = 0x61666564;
  local_818 = 7;
  local_809 = 0;
  local_800 = &local_7f0;
  local_7ec = 0x72;
  local_7f0 = 0x65666564;
  local_7f8 = 5;
  local_7eb = 0;
  local_7e0 = &local_7d0;
  local_7d0 = 0x6f64;
  local_7d8 = 2;
  local_7ce = 0;
  local_7c0 = &local_7b0;
  local_7b0 = 0x65736c65;
  local_7b8 = 4;
  local_7ac = 0;
  local_7a0 = &local_790;
  local_790 = 0x7268746c6c6166;
  uStack_789 = 0x6867756f;
  local_798 = 0xb;
  local_785 = 0;
  local_780 = &local_770;
  local_76e = 0x72;
  local_770 = 0x6f66;
  local_778 = 3;
  local_76d = 0;
  local_760 = &local_750;
  local_74c = 100;
  local_750 = 0x72617567;
  local_758 = 5;
  local_74b = 0;
  local_740 = &local_730;
  local_730 = 0x6669;
  local_738 = 2;
  local_72e = 0;
  local_720 = &local_710;
  local_710 = 0x6e69;
  local_718 = 2;
  local_70e = 0;
  local_700 = &local_6f0;
  local_6ec = 0x7461;
  local_6f0 = 0x65706572;
  local_6f8 = 6;
  local_6ea = 0;
  local_6e0 = &local_6d0;
  local_6cc = 0x6e72;
  local_6d0 = 0x75746572;
  local_6d8 = 6;
  local_6ca = 0;
  local_6c0 = &local_6b0;
  local_6ac = 0x6863;
  local_6b0 = 0x74697773;
  local_6b8 = 6;
  local_6aa = 0;
  local_6a0 = &local_690;
  local_68c = 0x65;
  local_690 = 0x72656877;
  local_698 = 5;
  local_68b = 0;
  local_680 = &local_670;
  local_66c = 0x65;
  local_670 = 0x6c696877;
  local_678 = 5;
  local_66b = 0;
  local_660 = &local_650;
  local_64e = 0x79;
  local_650 = 0x6e41;
  local_658 = 3;
  local_64d = 0;
  local_640 = &local_630;
  local_62c = 0x68;
  local_630 = 0x63746163;
  local_638 = 5;
  local_62b = 0;
  local_620 = &local_610;
  local_60c = 0x65;
  local_610 = 0x736c6166;
  local_618 = 5;
  local_60b = 0;
  local_600 = &local_5f0;
  local_5f0 = 0x7369;
  local_5f8 = 2;
  local_5ee = 0;
  local_5e0 = &local_5d0;
  local_5ce = 0x6c;
  local_5d0 = 0x696e;
  local_5d8 = 3;
  local_5cd = 0;
  local_5c0 = &local_5b0;
  local_5ac = 0x72;
  local_5b0 = 0x65707573;
  local_5b8 = 5;
  local_5ab = 0;
  local_5a0 = &local_590;
  local_590 = 0x666c6573;
  local_598 = 4;
  local_58c = 0;
  local_580 = &local_570;
  local_570 = 0x666c6553;
  local_578 = 4;
  local_56c = 0;
  local_560 = &local_550;
  local_550 = 0x6f726874;
  local_54c = 0x77;
  local_558 = 5;
  local_54b = 0;
  local_540 = &local_530;
  local_530 = 0x6f726874;
  local_52c = 0x7377;
  local_538 = 6;
  local_52a = 0;
  local_520 = &local_510;
  local_510 = 0x65757274;
  local_518 = 4;
  local_50c = 0;
  local_500 = &local_4f0;
  local_4ee = 0x79;
  local_4f0 = 0x7274;
  local_4f8 = 3;
  local_4ed = 0;
  local_4e0 = &local_4d0;
  uStack_4c8 = 0x7974697669;
  local_4d0 = 0x636f737361;
  uStack_4cb = 0x746169;
  local_4d8 = 0xd;
  local_4c3 = 0;
  local_4c0 = &local_4b0;
  local_4b0 = 0x696e65766e6f63;
  uStack_4a9 = 0x65636e65;
  local_4b8 = 0xb;
  local_4a5 = 0;
  local_4a0 = &local_490;
  uStack_48c = 0x63696d;
  local_490 = 0x616e7964;
  local_498 = 7;
  local_489 = 0;
  local_480 = &local_470;
  local_46c = 0x7465;
  local_470 = 0x53646964;
  local_478 = 6;
  local_46a = 0;
  local_460 = &local_450;
  local_44c = 0x6c;
  local_450 = 0x616e6966;
  local_458 = 5;
  local_44b = 0;
  local_440 = &local_430;
  local_42e = 0x74;
  local_430 = 0x6567;
  local_438 = 3;
  local_42d = 0;
  local_420 = &local_410;
  local_40c = 0x78;
  local_410 = 0x69666e69;
  local_418 = 5;
  local_40b = 0;
  local_400 = &local_3f0;
  local_3f0 = 0x7463657269646e69;
  local_3f8 = 8;
  local_3e8 = 0;
  local_3e0 = &local_3d0;
  local_3d0 = 0x797a616c;
  local_3d8 = 4;
  local_3cc = 0;
  local_3c0 = &local_3b0;
  local_3b0 = 0x7466656c;
  local_3b8 = 4;
  local_3ac = 0;
  local_3a0 = &local_390;
  local_390 = 0x676e69746174756d;
  local_398 = 8;
  local_388 = 0;
  local_380 = &local_370;
  local_370 = 0x656e6f6e;
  local_378 = 4;
  local_36c = 0;
  local_360 = &local_350;
  local_350 = 0x6174756d6e6f6e;
  uStack_349 = 0x676e6974;
  local_358 = 0xb;
  local_345 = 0;
  local_340 = &local_330;
  local_330 = 0x6c616e6f6974706f;
  local_338 = 8;
  local_328 = 0;
  local_320 = &local_310;
  local_310 = 0x656469727265766f;
  local_318 = 8;
  local_308 = 0;
  local_300 = &local_2f0;
  uStack_2ec = 0x786966;
  local_2f0 = 0x74736f70;
  local_2f8 = 7;
  local_2e9 = 0;
  local_2e0 = &local_2d0;
  local_2d0 = 0x6e65646563657270;
  local_2c8 = 0x6563;
  local_2d8 = 10;
  local_2c6 = 0;
  local_2c0 = &local_2b0;
  local_2ac = 0x7869;
  local_2b0 = 0x66657270;
  local_2b8 = 6;
  local_2aa = 0;
  local_2a0 = &local_290;
  local_290 = 0x6c6f636f746f7250;
  local_298 = 8;
  local_288 = 0;
  local_280 = &local_270;
  local_270 = 0x6465726975716572;
  local_278 = 8;
  local_268 = 0;
  local_260 = &local_250;
  local_24c = 0x74;
  local_250 = 0x68676972;
  local_258 = 5;
  local_24b = 0;
  local_240 = &local_230;
  local_22e = 0x74;
  local_230 = 0x6573;
  local_238 = 3;
  local_22d = 0;
  local_220 = &local_210;
  local_210 = 0x65707954;
  local_218 = 4;
  local_20c = 0;
  local_200 = &local_1f0;
  uStack_1ec = 0x64656e;
  local_1f0 = 0x776f6e75;
  local_1f8 = 7;
  local_1e9 = 0;
  local_1e0 = &local_1d0;
  local_1d0 = 0x6b616577;
  local_1d8 = 4;
  local_1cc = 0;
  local_1c0 = &local_1b0;
  uStack_1ac = 0x746553;
  local_1b0 = 0x6c6c6977;
  local_1b8 = 7;
  uStack_1a9 = 0;
  plVar2 = &local_190;
  local_190._0_4_ = 0x64696f56;
  local_1a0[1] = (long *)0x4;
  local_190._4_1_ = 0;
  __l._M_len = 0x4f;
  __l._M_array = &local_b60;
  local_1a0[0] = plVar2;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_ce0,__l,&local_d69,&local_d6a);
  lVar1 = -0x9e0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  IdlNamer::IdlNamer(&this->namer_,(Config *)local_180,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_ce0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_ce0);
  Namer::Config::~Config((Config *)local_180);
  Namer::Config::~Config(&local_cb0);
  this->namespace_depth = 0;
  local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b60,"  ","");
  std::__cxx11::string::_M_assign((string *)&(this->code_).pad_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
    operator_delete(local_b60._M_dataplus._M_p,
                    CONCAT26(local_b60.field_2._M_allocated_capacity._6_2_,
                             local_b60.field_2._M_allocated_capacity._0_6_) + 1);
  }
  return;
}

Assistant:

SwiftGenerator(const Parser &parser, const std::string &path,
                 const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", "_", "swift"),
        namer_(WithFlagOptions(SwiftDefaultConfig(), parser.opts, path),
               SwiftKeywords()) {
    namespace_depth = 0;
    code_.SetPadding("  ");
  }